

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O1

size_t wwOctetSize(word *a,size_t n)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = ~(n * 8);
  do {
    bVar5 = n == 0;
    n = n - 1;
    if (bVar5) {
      return 0;
    }
    uVar1 = a[n];
    uVar3 = uVar3 + 8;
  } while (uVar1 == 0);
  lVar2 = 7;
  if (uVar1 >> 0x38 == 0) {
    uVar4 = 0xff00000000000000;
    do {
      lVar2 = lVar2 + -1;
      uVar4 = uVar4 >> 8;
    } while ((uVar4 & uVar1) == 0);
  }
  return lVar2 - uVar3;
}

Assistant:

size_t wwOctetSize(const word a[], size_t n)
{
	ASSERT(wwIsValid(a, n));
	while (n-- && a[n] == 0);
	if (n == SIZE_MAX)
		return 0;
	{
		size_t pos = O_PER_W - 1;
		word mask = (word)0xFF << 8 * pos;
		while ((a[n] & mask) == 0)
			--pos, mask >>= 8;
		return n * O_PER_W + pos + 1;
	}
}